

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_false>::eval_divide_knuth
          (uintwide_t<32U,_unsigned_int,_void,_false> *this,
          uintwide_t<32U,_unsigned_int,_void,_false> *other,
          uintwide_t<32U,_unsigned_int,_void,_false> *remainder)

{
  value_type_conflict vVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  vVar1 = (this->values).super_array<unsigned_int,_1UL>.elems[0];
  uVar2 = (other->values).super_array<unsigned_int,_1UL>.elems[0];
  if (CONCAT44(0,uVar2) == 0) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0xffffffff;
  }
  else if (vVar1 != 0) {
    lVar12 = (ulong)(vVar1 != 0) << 2;
    lVar10 = 0;
    while (lVar10 != -4) {
      uVar3 = *(uint *)((long)(other->values).super_array<unsigned_int,_1UL>.elems + lVar10);
      uVar4 = *(uint *)((long)(this->values).super_array<unsigned_int,_1UL>.elems + lVar10);
      lVar10 = lVar10 + -4;
      if (uVar4 != uVar3) {
        if (uVar4 <= uVar3) {
          if (remainder != (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
            (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = vVar1;
          }
          (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
          return;
        }
        uVar9 = 0;
        uVar11 = 0;
        do {
          iVar5 = *(int *)((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar12);
          uVar11 = CONCAT44((int)uVar11 - (int)uVar9 * uVar2,iVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = CONCAT44(0,uVar2);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar11;
          uVar9 = SUB168(auVar7 / auVar6,0);
          iVar8 = SUB164(auVar7 / auVar6,0);
          *(int *)((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar12) = iVar8;
          lVar12 = lVar12 + -4;
        } while (lVar12 != 0);
        if (remainder == (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
          return;
        }
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = iVar5 - iVar8 * uVar2;
        return;
      }
    }
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 1;
  }
  if (remainder == (uintwide_t<32U,_unsigned_int,_void,_false> *)0x0) {
    return;
  }
  (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }